

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isonumber.c
# Opt level: O0

int isonumber_to_u64(uint64_t *dst,char *iso,uint64_t scaling)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int *piVar4;
  char *local_50;
  char *prefix;
  char *next;
  uint64_t factor;
  uint64_t fraction_scale;
  uint64_t num;
  uint64_t scaling_local;
  char *iso_local;
  uint64_t *dst_local;
  
  prefix = (char *)0x0;
  num = scaling;
  scaling_local = (uint64_t)iso;
  iso_local = (char *)dst;
  piVar4 = __errno_location();
  *piVar4 = 0;
  fraction_scale = strtoull((char *)scaling_local,&prefix,10);
  piVar4 = __errno_location();
  if (*piVar4 == 0) {
    if (*prefix == '\0') {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = num;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) < fraction_scale) {
        dst_local._4_4_ = -1;
      }
      else {
        *(uint64_t *)iso_local = fraction_scale * num;
        dst_local._4_4_ = 0;
      }
    }
    else {
      factor = 1;
      if (*prefix == '.') {
        while( true ) {
          prefix = prefix + 1;
          bVar1 = false;
          if ('/' < *prefix) {
            bVar1 = *prefix < ':';
          }
          if (!bVar1) break;
          fraction_scale = (long)(*prefix + -0x30) + fraction_scale * 10;
          factor = factor * 10;
        }
      }
      for (; factor < num; factor = factor * 10) {
        fraction_scale = fraction_scale * 10;
      }
      for (; *prefix == ' '; prefix = prefix + 1) {
      }
      next = (char *)0x1;
      if (*prefix != '\0') {
        if (prefix[1] != '\0') {
          return -1;
        }
        local_50 = strchr(" kMGTPE",(int)*prefix);
        if (local_50 == (char *)0x0) {
          return -1;
        }
        for (; " kMGTPE" < local_50; local_50 = local_50 + -1) {
          next = (char *)((long)next * 1000);
        }
      }
      while (num < factor && 999 < factor) {
        factor = factor / 1000;
        if (next < (char *)0x2) {
          fraction_scale = fraction_scale / 1000;
        }
        else {
          next = (char *)((ulong)next / 1000);
        }
      }
      auVar3._8_8_ = 0;
      auVar3._0_8_ = next;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar3,0) < fraction_scale) {
        dst_local._4_4_ = -1;
      }
      else {
        *(ulong *)iso_local = (fraction_scale * (long)next * num) / factor;
        dst_local._4_4_ = 0;
      }
    }
  }
  else {
    dst_local._4_4_ = -1;
  }
  return dst_local._4_4_;
}

Assistant:

int
isonumber_to_u64(uint64_t *dst, const char *iso, uint64_t scaling) {
  static const char symbol_large[] = " kMGTPE";

  uint64_t num, fraction_scale, factor;
  char *next = NULL, *prefix;

  errno = 0;
  num = strtoull(iso, &next, 10);
  if (errno) {
    return -1;
  }

  if (*next == 0) {
    if (num > UINT64_MAX / scaling) {
      /* this would be an integer overflow */
      return -1;
    }

    *dst = num * scaling;
    return 0;
  }

  /* Handle fractional part */
  fraction_scale = 1;
  if (*next == '.') {
    next++;
    while (*next >= '0' && *next <= '9') {
      num *= 10;
      num += (*next - '0');
      fraction_scale *= 10;
      next++;
    }
  }
  while (fraction_scale < scaling) {
    num *= 10;
    fraction_scale *= 10;
  }

  /* handle spaces */
  while (*next == ' ') {
    next++;
  }

  factor = 1;
  if (*next) {
    /* handle iso-prefix */
    if (next[1] != 0) {
      return -1;
    }

    prefix = strchr(symbol_large, next[0]);
    if (!prefix) {
      return -1;
    }

    while (prefix > symbol_large) {
      factor *= 1000;
      prefix--;
    }
  }

  while (fraction_scale > scaling && fraction_scale >= 1000) {
    fraction_scale /= 1000;
    if (factor > 1) {
      factor /= 1000;
    }
    else {
      num /= 1000;
    }
  }

  if (num > UINT64_MAX / factor) {
    /* this would be an integer overflow */
    return -1;
  }

  *dst = num * factor * scaling / fraction_scale;
  return 0;
}